

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

int SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,realtype beta)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    iVar3 = -0x385;
  }
  else {
    iVar3 = -0x387;
    if (0.0 < beta) {
      bVar2 = beta < 1.0;
      pvVar1 = NLS->content;
      if (1.0 <= beta) {
        beta = 1.0;
      }
      *(realtype *)((long)pvVar1 + 0x28) = beta;
      *(uint *)((long)pvVar1 + 0x20) = (uint)bVar2;
      return 0;
    }
  }
  return iVar3;
}

Assistant:

int SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS, realtype beta)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that beta is a vaild */
  if (beta <= ZERO)
    return(SUN_NLS_ILL_INPUT);

  if (beta < ONE) {
    /* enable damping */
    FP_CONTENT(NLS)->beta    = beta;
    FP_CONTENT(NLS)->damping = SUNTRUE;
  } else {
    /* disable damping */
    FP_CONTENT(NLS)->beta    = ONE;
    FP_CONTENT(NLS)->damping = SUNFALSE;
  }

  return(SUN_NLS_SUCCESS);
}